

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Zp_field.h
# Opt level: O1

Element_conflict
Gudhi::persistence_fields::Zp_field_element<2U,_unsigned_int,_void>::_multiply
          (Element_conflict element,Element_conflict v)

{
  Element_conflict EVar1;
  Element_conflict a;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  Element_conflict EVar2;
  
  uVar4 = (ulong)element;
  EVar1 = 0;
  if (element != 0) {
    do {
      if ((uVar4 & 1) != 0) {
        EVar2 = EVar1 - 2;
        if (v < 2 - EVar1) {
          EVar2 = EVar1;
        }
        EVar1 = EVar2 + v;
      }
      uVar3 = (uint)uVar4;
      uVar4 = uVar4 >> 1;
      uVar5 = v - 2;
      if (v < 2 - v) {
        uVar5 = v;
      }
      v = uVar5 + v;
    } while (1 < uVar3);
  }
  return EVar1;
}

Assistant:

static Element _multiply(Element element, Element v) {
    Element a = element;
    element = 0;
    Element temp_b;

    while (a != 0) {
      if (a & 1) {
        if (v >= characteristic - element) element -= characteristic;
        element += v;
      }
      a >>= 1;

      temp_b = v;
      if (v >= characteristic - v) temp_b -= characteristic;
      v += temp_b;
    }

    return element;
  }